

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t archive_match_exclude_entry(archive *_a,wchar_t flag,archive_entry *entry)

{
  int iVar1;
  wchar_t wVar2;
  archive_rb_node *self;
  char *pcVar3;
  archive_rb_node *paVar4;
  uintptr_t uVar5;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_time_include_entry");
  if (iVar1 == -0x1e) {
    return L'\xffffffe2';
  }
  if (entry == (archive_entry *)0x0) {
    pcVar3 = "entry is NULL";
  }
  else {
    wVar2 = validate_time_flag(_a,flag,"archive_match_exclude_entry");
    if (wVar2 != L'\0') {
      return wVar2;
    }
    self = (archive_rb_node *)calloc(1,0xb0);
    if (self == (archive_rb_node *)0x0) {
      archive_set_error(_a,0xc,"No memory");
      _a->state = 0x8000;
      return L'\xffffffe2';
    }
    pcVar3 = archive_entry_pathname(entry);
    if (pcVar3 != (char *)0x0) {
      archive_mstring_copy_mbs((archive_mstring *)(self[1].rb_nodes + 1),pcVar3);
      _a[2].compression_name = (char *)&rb_ops_mbs;
      *(wchar_t *)&self[5].rb_info = flag;
      paVar4 = (archive_rb_node *)archive_entry_mtime(entry);
      self[6].rb_nodes[0] = paVar4;
      paVar4 = (archive_rb_node *)archive_entry_mtime_nsec(entry);
      self[6].rb_nodes[1] = paVar4;
      uVar5 = archive_entry_ctime(entry);
      self[6].rb_info = uVar5;
      paVar4 = (archive_rb_node *)archive_entry_ctime_nsec(entry);
      self[7].rb_nodes[0] = paVar4;
      iVar1 = __archive_rb_tree_insert_node((archive_rb_tree *)&_a[2].compression_code,self);
      if (iVar1 == 0) {
        paVar4 = __archive_rb_tree_find_node((archive_rb_tree *)&_a[2].compression_code,pcVar3);
        if (paVar4 != (archive_rb_node *)0x0) {
          *(int *)&paVar4[5].rb_info = (int)self[5].rb_info;
          paVar4[6].rb_nodes[0] = self[6].rb_nodes[0];
          paVar4[6].rb_nodes[1] = self[6].rb_nodes[1];
          paVar4[6].rb_info = self[6].rb_info;
          paVar4[7].rb_nodes[0] = self[7].rb_nodes[0];
        }
        archive_mstring_clean((archive_mstring *)(self[1].rb_nodes + 1));
        free(self);
      }
      else {
        *(archive_rb_node **)_a[2].error = self;
        _a[2].error = (char *)(self + 1);
        *(int *)&_a[2].error_string.s = *(int *)&_a[2].error_string.s + 1;
        *(byte *)&_a[1].magic = (byte)_a[1].magic | 2;
      }
      return L'\0';
    }
    free(self);
    pcVar3 = "pathname is NULL";
  }
  archive_set_error(_a,0x16,pcVar3);
  return L'\xffffffe7';
}

Assistant:

int
archive_match_exclude_entry(struct archive *_a, int flag,
    struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_time_include_entry");
	a = (struct archive_match *)_a;

	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}
	r = validate_time_flag(_a, flag, "archive_match_exclude_entry");
	if (r != ARCHIVE_OK)
		return (r);
	return (add_entry(a, flag, entry));
}